

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O2

IConnection * __thiscall
tonk::ConnectionAddrMap::FindByAddr(ConnectionAddrMap *this,UDPAddress *addr)

{
  atomic<int> *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  IConnection *pIVar7;
  Locker locker;
  Locker local_28;
  
  local_28.TheLock = &this->AddressMapLock;
  std::recursive_mutex::lock(&(local_28.TheLock)->cs);
  bVar5 = asio::ip::detail::operator==(&addr->impl_,&(this->RecentAddress).impl_);
  if (bVar5) {
    pIVar7 = this->RecentConnection;
    if (pIVar7 != (IConnection *)0x0) {
LAB_00152391:
      LOCK();
      paVar1 = &(pIVar7->SelfRefCount).RefCount;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      goto LAB_0015239c;
    }
  }
  else {
    uVar6 = LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
            ::find_index(&(this->AddressMap).TheMap,addr);
    if ((-1 < (int)uVar6) &&
       (pIVar7 = *(IConnection **)((this->AddressMap).TheMap.m_values[uVar6].m_bits + 0x20),
       pIVar7 != (IConnection *)0x0)) {
      uVar2 = *(undefined8 *)&(addr->impl_).data_;
      uVar3 = *(undefined8 *)((long)&(addr->impl_).data_ + 8);
      uVar4 = *(undefined8 *)((long)&(addr->impl_).data_ + 0x14);
      *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0xc) =
           *(undefined8 *)((long)&(addr->impl_).data_ + 0xc);
      *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 0x14) = uVar4;
      *(undefined8 *)&(this->RecentAddress).impl_.data_ = uVar2;
      *(undefined8 *)((long)&(this->RecentAddress).impl_.data_ + 8) = uVar3;
      this->RecentConnection = pIVar7;
      goto LAB_00152391;
    }
  }
  pIVar7 = (IConnection *)0x0;
LAB_0015239c:
  Locker::~Locker(&local_28);
  return pIVar7;
}

Assistant:

IConnection* ConnectionAddrMap::FindByAddr(const UDPAddress& addr)
{
    TONK_DEBUG_ASSERT(!addr.address().is_unspecified());

    Locker locker(AddressMapLock);

    IConnection* connection;

    if (addr == RecentAddress) {
        connection = RecentConnection;
    }
    else
    {
        connection = AddressMap.Find(addr);
        if (connection)
        {
            RecentAddress = addr;
            RecentConnection = connection;
        }
    }

    if (connection) {
        connection->SelfRefCount.IncrementReferences();
    }
    return connection;
}